

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::trimr(basic_substring<const_char> *this,char c)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  error_flags eVar4;
  char *s_;
  size_t sVar5;
  ulong uVar6;
  char *pcVar7;
  basic_substring<const_char> bVar8;
  basic_substring<const_char> local_20;
  
  s_ = this->str;
  uVar1 = this->len;
  if (s_ == (char *)0x0 || uVar1 == 0) {
    sVar5 = 0;
  }
  else {
    uVar6 = ~uVar1;
    pcVar7 = s_ + uVar1;
    do {
      pcVar7 = pcVar7 + -1;
      sVar5 = 0;
      if (uVar6 == 0xffffffffffffffff) goto LAB_001d9336;
      uVar6 = uVar6 + 1;
    } while (*pcVar7 == c);
    sVar5 = -uVar6;
    if (uVar6 == 1) {
      sVar5 = uVar1;
    }
    if (uVar1 < sVar5) {
      eVar4 = get_error_flags();
      if ((eVar4 & 1) != 0) {
        bVar3 = is_debugger_attached();
        if (bVar3) {
          pcVar2 = (code *)swi(3);
          bVar8 = (basic_substring<const_char>)(*pcVar2)();
          return bVar8;
        }
      }
      handle_error(0x2467aa,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
    }
    basic_substring(&local_20,s_,sVar5);
    s_ = local_20.str;
    sVar5 = local_20.len;
  }
LAB_001d9336:
  bVar8.len = sVar5;
  bVar8.str = s_;
  return bVar8;
}

Assistant:

basic_substring trimr(const C c) const
    {
        if( ! empty())
        {
            size_t pos = last_not_of(c, npos);
            if(pos != npos)
                return sub(0, pos+1);
        }
        return sub(0, 0);
    }